

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_swift_generator.cc
# Opt level: O0

string * __thiscall
t_swift_generator::type_name_abi_cxx11_
          (string *__return_storage_ptr__,t_swift_generator *this,t_type *ttype,bool is_optional,
          bool is_forced)

{
  uint uVar1;
  int iVar2;
  t_type *ptVar3;
  undefined4 extraout_var;
  t_program *program_00;
  string local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  t_swift_generator *local_1f8;
  t_program *program;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  t_map *local_190;
  t_list *list;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  t_map *local_128;
  t_set *set;
  string local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  t_map *local_60;
  t_map *map;
  allocator local_24;
  undefined1 local_23;
  byte local_22;
  byte local_21;
  bool is_forced_local;
  t_map *ptStack_20;
  bool is_optional_local;
  t_type *ttype_local;
  t_swift_generator *this_local;
  string *result;
  
  local_23 = 0;
  local_22 = is_forced;
  local_21 = is_optional;
  ptStack_20 = (t_map *)ttype;
  ttype_local = (t_type *)this;
  this_local = (t_swift_generator *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_24);
  std::allocator<char>::~allocator((allocator<char> *)&local_24);
  uVar1 = (*(ptStack_20->super_t_container).super_t_type.super_t_doc._vptr_t_doc[5])();
  if ((uVar1 & 1) == 0) {
    uVar1 = (*(ptStack_20->super_t_container).super_t_type.super_t_doc._vptr_t_doc[0x10])();
    if ((uVar1 & 1) == 0) {
      uVar1 = (*(ptStack_20->super_t_container).super_t_type.super_t_doc._vptr_t_doc[0xf])();
      if ((uVar1 & 1) == 0) {
        uVar1 = (*(ptStack_20->super_t_container).super_t_type.super_t_doc._vptr_t_doc[0xe])();
        if ((uVar1 & 1) == 0) {
          local_1f8 = (t_swift_generator *)t_type::get_program((t_type *)ptStack_20);
          if (((this->namespaced_ & 1U) != 0) &&
             (local_1f8 !=
              (t_swift_generator *)(this->super_t_oop_generator).super_t_generator.program_)) {
            get_real_swift_module_abi_cxx11_(&local_238,local_1f8,program_00);
            std::operator+(&local_218,&local_238,".");
            std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_218);
            std::__cxx11::string::~string((string *)&local_218);
            std::__cxx11::string::~string((string *)&local_238);
          }
          iVar2 = (*(ptStack_20->super_t_container).super_t_type.super_t_doc._vptr_t_doc[3])();
          std::__cxx11::string::operator+=
                    ((string *)__return_storage_ptr__,(string *)CONCAT44(extraout_var,iVar2));
        }
        else {
          local_190 = ptStack_20;
          ptVar3 = t_list::get_elem_type((t_list *)ptStack_20);
          type_name_abi_cxx11_((string *)&program,this,ptVar3,false,false);
          std::operator+(&local_1d0,"TList<",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &program);
          std::operator+(&local_1b0,&local_1d0,">");
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_1b0);
          std::__cxx11::string::~string((string *)&local_1b0);
          std::__cxx11::string::~string((string *)&local_1d0);
          std::__cxx11::string::~string((string *)&program);
        }
      }
      else {
        local_128 = ptStack_20;
        ptVar3 = t_set::get_elem_type((t_set *)ptStack_20);
        type_name_abi_cxx11_((string *)&list,this,ptVar3,false,false);
        std::operator+(&local_168,"TSet<",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&list);
        std::operator+(&local_148,&local_168,">");
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_148);
        std::__cxx11::string::~string((string *)&local_148);
        std::__cxx11::string::~string((string *)&local_168);
        std::__cxx11::string::~string((string *)&list);
      }
    }
    else {
      local_60 = ptStack_20;
      ptVar3 = t_map::get_key_type(ptStack_20);
      type_name_abi_cxx11_(&local_100,this,ptVar3,false,false);
      std::operator+(&local_e0,"TMap<",&local_100);
      std::operator+(&local_c0,&local_e0,", ");
      ptVar3 = t_map::get_val_type(local_60);
      type_name_abi_cxx11_((string *)&set,this,ptVar3,false,false);
      std::operator+(&local_a0,&local_c0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&set);
      std::operator+(&local_80,&local_a0,">");
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_80);
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::~string((string *)&local_a0);
      std::__cxx11::string::~string((string *)&set);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_100);
    }
  }
  else {
    base_type_name_abi_cxx11_((string *)&map,this,(t_base_type *)ptStack_20);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&map);
    std::__cxx11::string::~string((string *)&map);
  }
  if ((local_21 & 1) != 0) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"?");
  }
  if ((local_22 & 1) != 0) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"!");
  }
  return __return_storage_ptr__;
}

Assistant:

string t_swift_generator::type_name(t_type* ttype, bool is_optional, bool is_forced) {
  string result = "";

  if (ttype->is_base_type()) {
    result += base_type_name((t_base_type*)ttype);
  } else if (ttype->is_map()) {
    t_map *map = (t_map *)ttype;
    result += "TMap<" + type_name(map->get_key_type()) + ", " + type_name(map->get_val_type()) + ">";
  } else if (ttype->is_set()) {
    t_set *set = (t_set *)ttype;
    result += "TSet<" + type_name(set->get_elem_type()) + ">";
  } else if (ttype->is_list()) {
    t_list *list = (t_list *)ttype;
    result += "TList<" + type_name(list->get_elem_type()) + ">";
  }
  else {
    t_program* program = ttype->get_program();
    if (namespaced_ && program != program_) {
      result += get_real_swift_module(program) + ".";
    }
    result += ttype->get_name();
  }

  if (is_optional) {
    result += "?";
  }
  if (is_forced) {
    result += "!";
  }

  return result;
}